

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

void Cnf_CutFree(Cnf_Cut_t *pCut)

{
  Cnf_Cut_t *pCut_local;
  
  if (pCut->vIsop[0] != (Vec_Int_t *)0x0) {
    Vec_IntFree(pCut->vIsop[0]);
  }
  if (pCut->vIsop[1] != (Vec_Int_t *)0x0) {
    Vec_IntFree(pCut->vIsop[1]);
  }
  return;
}

Assistant:

void Cnf_CutFree( Cnf_Cut_t * pCut )
{
    if ( pCut->vIsop[0] )
        Vec_IntFree( pCut->vIsop[0] );
    if ( pCut->vIsop[1] )
        Vec_IntFree( pCut->vIsop[1] );
}